

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O3

void CESkyCoord::Galactic2ICRS(CESkyCoord *in_galactic,CESkyCoord *out_icrs)

{
  double dVar1;
  double dec;
  double ra;
  double local_d0;
  double local_c8;
  CEAngle local_c0;
  double local_b0;
  CEAngle local_a8;
  CEDate local_98;
  CEDate local_58;
  
  local_c8 = 0.0;
  local_d0 = 0.0;
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_58,dVar1,JD);
  (*in_galactic->_vptr_CESkyCoord[3])(&local_c0,in_galactic,&local_58);
  local_b0 = CEAngle::Rad(&local_c0);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_98,dVar1,JD);
  (*in_galactic->_vptr_CESkyCoord[4])(&local_a8,in_galactic,&local_98);
  dVar1 = CEAngle::Rad(&local_a8);
  iauG2icrs(local_b0,SUB84(dVar1,0),&local_c8,&local_d0);
  CEAngle::~CEAngle(&local_a8);
  CEDate::~CEDate(&local_98);
  CEAngle::~CEAngle(&local_c0);
  CEDate::~CEDate(&local_58);
  CEAngle::CEAngle((CEAngle *)&local_58,&local_c8);
  CEAngle::CEAngle((CEAngle *)&local_98,&local_d0);
  local_c0._vptr_CEAngle._0_4_ = 1;
  (*out_icrs->_vptr_CESkyCoord[5])(out_icrs,&local_58,&local_98);
  CEAngle::~CEAngle((CEAngle *)&local_98);
  CEAngle::~CEAngle((CEAngle *)&local_58);
  return;
}

Assistant:

void CESkyCoord::Galactic2ICRS(const CESkyCoord& in_galactic,
                               CESkyCoord*       out_icrs)
{
    // Do the Galactic -> ICRS converstion
    double ra(0.0);
    double dec(0.0);
    iauG2icrs(in_galactic.XCoord().Rad(), 
              in_galactic.YCoord().Rad(), 
              &ra, &dec);
    out_icrs->SetCoordinates(ra, dec, CESkyCoordType::ICRS);
    
    return;
}